

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O3

QString * __thiscall
QFileSystemModelPrivate::name
          (QString *__return_storage_ptr__,QFileSystemModelPrivate *this,QModelIndex *index)

{
  QString *defaultValue;
  Data *pDVar1;
  Data *pDVar2;
  bool bVar3;
  char cVar4;
  QFileSystemModelPrivate *this_00;
  long in_FS_OFFSET;
  QString local_70;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((index->r < 0) || (index->c < 0)) || ((index->m).ptr == (QAbstractItemModel *)0x0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
  }
  else {
    defaultValue = (QString *)index->i;
    this_00 = this;
    bVar3 = QFileInfoGatherer::resolveSymlinks
                      ((QFileInfoGatherer *)
                       (this->fileInfoGatherer)._M_t.
                       super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>
                       .super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl);
    if (((bVar3) && (pDVar1 = (this->resolvedSymLinks).d, pDVar1 != (Data *)0x0)) &&
       ((pDVar1->size != 0 &&
        ((defaultValue[2].d.ptr != (char16_t *)0x0 &&
         (cVar4 = QFileInfo::isSymLink(), cVar4 != '\0')))))) {
      local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      filePath(&local_70,this_00,index);
      QDir::fromNativeSeparators((QString *)&local_58);
      if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
        }
      }
      QHash<QString,_QString>::value
                (__return_storage_ptr__,&this->resolvedSymLinks,&local_58,defaultValue);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      pDVar2 = (defaultValue->d).d;
      (__return_storage_ptr__->d).d = pDVar2;
      (__return_storage_ptr__->d).ptr = (defaultValue->d).ptr;
      (__return_storage_ptr__->d).size = (defaultValue->d).size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QString QFileSystemModelPrivate::name(const QModelIndex &index) const
{
    if (!index.isValid())
        return QString();
    QFileSystemNode *dirNode = node(index);
    if (
#if QT_CONFIG(filesystemwatcher)
        fileInfoGatherer->resolveSymlinks() &&
#endif
        !resolvedSymLinks.isEmpty() && dirNode->isSymLink(/* ignoreNtfsSymLinks = */ true)) {
        QString fullPath = QDir::fromNativeSeparators(filePath(index));
        return resolvedSymLinks.value(fullPath, dirNode->fileName);
    }
    return dirNode->fileName;
}